

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff_expr.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t var_id;
  uint32_t var_id_00;
  uint32_t var_id_01;
  uint32_t var_id_02;
  uint32_t var_id_03;
  uint32_t var_id_04;
  uint32_t var_id_05;
  uint32_t var_id_06;
  uint32_t var_id_07;
  uint32_t var_id_08;
  uint32_t var_id_09;
  uint32_t var_id_10;
  uint32_t var_id_11;
  uint32_t var_id_12;
  uint32_t var_id_13;
  uint32_t var_id_14;
  uint32_t var_id_15;
  uint32_t var_id_16;
  uint32_t var_id_17;
  uint32_t var_id_18;
  uint32_t var_id_19;
  uint32_t var_id_20;
  uint32_t var_id_21;
  uint32_t var_id_22;
  uint32_t var_id_23;
  uint32_t var_id_24;
  uint32_t var_id_25;
  uint32_t var_id_26;
  uint32_t var_id_27;
  uint32_t var_id_28;
  uint32_t var_id_29;
  uint32_t var_id_30;
  uint32_t var_id_31;
  uint32_t var_id_32;
  uint32_t var_id_33;
  uint32_t var_id_34;
  uint32_t var_id_35;
  uint uVar5;
  string local_68;
  string local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"x","");
  nivalis::Environment::addr_of((Environment *)&(anonymous_namespace)::env,&local_68,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
  nivalis::Environment::set((Environment *)&(anonymous_namespace)::env,&local_68,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nan","");
  paVar2 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"nan","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random(&local_68,&local_48,var_id,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"nan\", \"nan\", 0)",0x27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  uVar5 = (uint)!bVar3;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"e","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_00,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"e\", \"0\", 0)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a*x","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_01,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"a*x\", \"a\", 0)",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a^2*x^2","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"2*a^2*x","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_02,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"a^2*x^2\", \"2*a^2*x\", 0)",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"x^3","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"3*x^2","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_03,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"x^3\", \"3*x^2\", 0)",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"x^(-1)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-1/x^2","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_04,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"x^(-1)\", \"-1/x^2\", 0)",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"1/x","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-x^(-2)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_05,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"1/x\", \"-x^(-2)\", 0)",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"x/(1+x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/(1+x)^2","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_06,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"x/(1+x)\", \"1/(1+x)^2\", 0)",0x31);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"log(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/x","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_07,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"log(x)\", \"1/x\", 0)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"log2(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/(x*ln(2))","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_08,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"log2(x)\", \"1/(x*ln(2))\", 0)",0x33)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"log(x,a)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/(x*ln(a))","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_09,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"log(x,a)\", \"1/(x*ln(a))\", 0)",0x34
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sin(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"cos(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_10,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"sin(x)\", \"cos(x)\", 0)",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cos(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-sin(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_11,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"cos(x)\", \"-sin(x)\", 0)",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"tan(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/cos(x)^2","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_12,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"tan(x)\", \"1/cos(x)^2\", 0)",0x31);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"arcsin(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/sqrt(1-x^2)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_13,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"arcsin(x)\", \"1/sqrt(1-x^2)\", 0)",
               0x37);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"arccos(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-1/sqrt(1-x^2)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_14,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"arccos(x)\", \"-1/sqrt(1-x^2)\", 0)",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"arctan(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1/(1+x^2)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_15,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"arctan(x)\", \"1/(1+x^2)\", 0)",0x33)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sinh(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"cosh(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_16,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"sinh(x)\", \"cosh(x)\", 0)",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cosh(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"sinh(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_17,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"cosh(x)\", \"sinh(x)\", 0)",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"tanh(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1-tanh(x)^2","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_18,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"tanh(x)\", \"1-tanh(x)^2\", 0)",0x33)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sin(x)*cos(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"cos(x)^2-sin(x)^2","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_19,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"sin(x)*cos(x)\", \"cos(x)^2-sin(x)^2\", 0)",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sin(x)^2","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"2*sin(x)*cos(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_20,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"sin(x)^2\", \"2*sin(x)*cos(x)\", 0)",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x41);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sin(cos(x))","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-cos(cos(x))*sin(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_21,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"sin(cos(x))\", \"-cos(cos(x))*sin(x)\", 0)",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x42);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"exp(2*x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"2*exp(2*x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_22,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"exp(2*x)\", \"2*exp(2*x)\", 0)",0x33)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x43);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"exp(abs(x))","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"exp(abs(x))*sgn(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_23,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"exp(abs(x))\", \"exp(abs(x))*sgn(x)\", 0)",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"exp2(-x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"log(2)*-1*exp2(-x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_24,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"exp2(-x)\", \"log(2)*-1*exp2(-x)\", 0)",0x3b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"3^(-x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ln(3)*-1*3^(-x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random(&local_68,&local_48,var_id_25,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"3^(-x)\", \"ln(3)*-1*3^(-x)\", 0, -10.0, 10.0)",0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
  nivalis::Environment::set((Environment *)&(anonymous_namespace)::env,&local_68,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a^(-x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ln(a)*-1*a^(-x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random(&local_68,&local_48,var_id_26,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"a^(-x)\", \"ln(a)*-1*a^(-x)\", 0, -10.0, 10.0)",0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"abs(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"sgn(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_27,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"abs(x)\", \"sgn(x)\", 0)",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"abs(x^2)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"2*x*(x!=0)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_28,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"abs(x^2)\", \"2*x*(x!=0)\", 0)",0x33)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sgn(x^2)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_29,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"sgn(x^2)\", \"0\", 0)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"floor(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_30,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"floor(x)\", \"0\", 0)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"choose(x,x/2)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_31,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_derivative_random(\"choose(x,x/2)\", \"0\", 0)",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"gamma(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"gamma(x)*digamma(x)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_32,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"gamma(x)\", \"gamma(x)*digamma(x)\", 0)",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"fact(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"gamma(x+1)*digamma(x+1)","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_33,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"fact(x)\", \"gamma(x+1)*digamma(x+1)\", 0)",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"N(x)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"-1/(sqrt(2*pi))*exp(-0.5*x^2)*x","");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random(&local_68,&local_48,var_id_34,-2.0,2.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"N(x)\", \"-1/(sqrt(2*pi))*exp(-0.5*x^2)*x\", 0, -2.0, 2.0)"
               ,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"beta(x,x^2)","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + 2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))"
             ,"");
  bVar3 = anon_unknown.dwarf_388f::test_derivative_random
                    (&local_68,&local_48,var_id_35,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_derivative_random(\"beta(x,x^2)\", \"beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + \" \"2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))\", 0)"
               ,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_diff_expr",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x56);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"test_diff_expr",0xe);
  if (uVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": all passed\n",0xd);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," asserts FAILED\n",0x10);
  }
  return (uint)(uVar5 != 0);
}

Assistant:

int main() {
    BEGIN_TEST(test_diff_expr);

    env.addr_of("x", false); env.set("a", 3.0);
    ASSERT(test_derivative_random("nan", "nan", 0));
    ASSERT(test_derivative_random("e", "0", 0));
    ASSERT(test_derivative_random("a*x", "a", 0));
    ASSERT(test_derivative_random("a^2*x^2", "2*a^2*x", 0));
    ASSERT(test_derivative_random("x^3", "3*x^2", 0));
    ASSERT(test_derivative_random("x^(-1)", "-1/x^2", 0));
    ASSERT(test_derivative_random("1/x", "-x^(-2)", 0));
    ASSERT(test_derivative_random("x/(1+x)", "1/(1+x)^2", 0));
    ASSERT(test_derivative_random("log(x)", "1/x", 0));
    ASSERT(test_derivative_random("log2(x)", "1/(x*ln(2))", 0));
    ASSERT(test_derivative_random("log(x,a)", "1/(x*ln(a))", 0));
    ASSERT(test_derivative_random("sin(x)", "cos(x)", 0));
    ASSERT(test_derivative_random("cos(x)", "-sin(x)", 0));
    ASSERT(test_derivative_random("tan(x)", "1/cos(x)^2", 0));
    ASSERT(test_derivative_random("arcsin(x)", "1/sqrt(1-x^2)", 0));
    ASSERT(test_derivative_random("arccos(x)", "-1/sqrt(1-x^2)", 0));
    ASSERT(test_derivative_random("arctan(x)", "1/(1+x^2)", 0));
    ASSERT(test_derivative_random("sinh(x)", "cosh(x)", 0));
    ASSERT(test_derivative_random("cosh(x)", "sinh(x)", 0));
    ASSERT(test_derivative_random("tanh(x)", "1-tanh(x)^2", 0));
    ASSERT(test_derivative_random("sin(x)*cos(x)", "cos(x)^2-sin(x)^2", 0));
    ASSERT(test_derivative_random("sin(x)^2", "2*sin(x)*cos(x)", 0));
    ASSERT(test_derivative_random("sin(cos(x))", "-cos(cos(x))*sin(x)", 0));
    ASSERT(test_derivative_random("exp(2*x)", "2*exp(2*x)", 0));
    ASSERT(test_derivative_random("exp(abs(x))", "exp(abs(x))*sgn(x)", 0));
    ASSERT(test_derivative_random("exp2(-x)", "log(2)*-1*exp2(-x)", 0));
    ASSERT(test_derivative_random("3^(-x)", "ln(3)*-1*3^(-x)", 0,
            -10.0, 10.0));
    env.set("a", 0.5);
    ASSERT(test_derivative_random("a^(-x)", "ln(a)*-1*a^(-x)", 0,
                -10.0, 10.0));
    ASSERT(test_derivative_random("abs(x)", "sgn(x)", 0));
    ASSERT(test_derivative_random("abs(x^2)", "2*x*(x!=0)", 0));
    ASSERT(test_derivative_random("sgn(x^2)", "0", 0));
    ASSERT(test_derivative_random("floor(x)", "0", 0));
    ASSERT(test_derivative_random("choose(x,x/2)", "0", 0));
    ASSERT(test_derivative_random("gamma(x)", "gamma(x)*digamma(x)", 0));
    ASSERT(test_derivative_random("fact(x)", "gamma(x+1)*digamma(x+1)", 0));
    ASSERT(test_derivative_random("N(x)", "-1/(sqrt(2*pi))*exp(-0.5*x^2)*x", 0,
                -2.0, 2.0));
    ASSERT(test_derivative_random("beta(x,x^2)",
                "beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + "
                "2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))", 0));

    END_TEST;
}